

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_inlined(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int i;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int s;
  int col;
  int iVar11;
  int row;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_register_00001384 [12];
  float local_e8;
  int local_e0;
  long local_d8;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float local_78;
  float local_68;
  undefined1 extraout_var [60];
  
  auVar14._8_4_ = 0x3effffff;
  auVar14._0_8_ = 0x3effffff3effffff;
  auVar14._12_4_ = 0x3effffff;
  auVar20._8_4_ = 0x80000000;
  auVar20._0_8_ = 0x8000000080000000;
  auVar20._12_4_ = 0x80000000;
  fVar19 = ipoint->scale;
  auVar12 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)fVar19),auVar20,0xf8);
  auVar12 = ZEXT416((uint)(fVar19 + auVar12._0_4_));
  auVar12 = vroundss_avx(auVar12,auVar12,0xb);
  s = (int)(auVar12._0_4_ + auVar12._0_4_);
  auVar13 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)ipoint->y),auVar20,0xf8);
  auVar12 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)ipoint->x),auVar20,0xf8);
  auVar16._0_8_ = (double)fVar19;
  auVar16._8_8_ = 0;
  auVar12 = ZEXT416((uint)(ipoint->x + auVar12._0_4_));
  auVar12 = vroundss_avx(auVar12,auVar12,0xb);
  auVar15._0_8_ = (double)auVar12._0_4_;
  auVar15._8_8_ = auVar12._8_8_;
  auVar20 = vfmadd231sd_fma(auVar15,auVar16,ZEXT816(0x3fe0000000000000));
  fVar31 = -2.5;
  auVar12 = ZEXT416((uint)(ipoint->y + auVar13._0_4_));
  auVar12 = vroundss_avx(auVar12,auVar12,0xb);
  auVar13._0_8_ = (double)auVar12._0_4_;
  auVar13._8_8_ = auVar12._8_8_;
  auVar12 = vfmadd231sd_fma(auVar13,auVar16,ZEXT816(0x3fe0000000000000));
  auVar29 = ZEXT864(0) << 0x20;
  iVar11 = 0;
  local_d8 = 0;
  for (iVar7 = -8; iVar7 < 8; iVar7 = iVar7 + 5) {
    fVar31 = fVar31 + 1.0;
    auVar38._0_4_ = (float)iVar7;
    auVar38._4_12_ = in_register_00001384;
    local_d8 = (long)(int)local_d8;
    auVar13 = vfmadd132ss_fma(auVar38,ZEXT416((uint)(float)auVar20._0_8_),ZEXT416((uint)fVar19));
    auVar32._8_4_ = 0x3effffff;
    auVar32._0_8_ = 0x3effffff3effffff;
    auVar32._12_4_ = 0x3effffff;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar14 = vpternlogd_avx512vl(auVar32,auVar13,auVar1,0xf8);
    auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
    auVar13 = vroundss_avx(auVar13,auVar13,0xb);
    auVar33._0_4_ = (int)auVar13._0_4_;
    auVar33._4_4_ = (int)auVar13._4_4_;
    auVar33._8_4_ = (int)auVar13._8_4_;
    auVar33._12_4_ = (int)auVar13._12_4_;
    auVar13 = vcvtdq2ps_avx(auVar33);
    local_e0 = -3;
    iVar10 = -8;
    local_e8 = -2.5;
    while (iVar10 < 8) {
      iVar6 = iVar10 + -4;
      local_e8 = local_e8 + 1.0;
      auVar21._0_4_ = (float)iVar10;
      auVar21._4_12_ = in_register_00001384;
      auVar14 = vfmadd132ss_fma(auVar21,ZEXT416((uint)(float)auVar12._0_8_),ZEXT416((uint)fVar19));
      auVar34._8_4_ = 0x3effffff;
      auVar34._0_8_ = 0x3effffff3effffff;
      auVar34._12_4_ = 0x3effffff;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar15 = vpternlogd_avx512vl(auVar34,auVar14,auVar2,0xf8);
      auVar14 = ZEXT416((uint)(auVar14._0_4_ + auVar15._0_4_));
      auVar14 = vroundss_avx(auVar14,auVar14,0xb);
      auVar22._0_4_ = (int)auVar14._0_4_;
      auVar22._4_4_ = (int)auVar14._4_4_;
      auVar22._8_4_ = (int)auVar14._8_4_;
      auVar22._12_4_ = (int)auVar14._12_4_;
      auVar14 = vcvtdq2ps_avx(auVar22);
      _local_98 = ZEXT816(0) << 0x20;
      for (; iVar6 != local_e0; iVar6 = iVar6 + 1) {
        auVar23._0_4_ = (float)iVar6;
        auVar23._4_12_ = in_register_00001384;
        auVar15 = vfmadd132ss_fma(auVar23,ZEXT416((uint)(float)auVar12._0_8_),ZEXT416((uint)fVar19))
        ;
        auVar35._8_4_ = 0x3effffff;
        auVar35._0_8_ = 0x3effffff3effffff;
        auVar35._12_4_ = 0x3effffff;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar16 = vpternlogd_avx512vl(auVar35,auVar15,auVar3,0xf8);
        local_78 = auVar14._0_4_;
        auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
        auVar15 = vroundss_avx(auVar15,auVar15,0xb);
        row = (int)auVar15._0_4_;
        auVar24._0_4_ = (int)auVar15._0_4_;
        auVar24._4_4_ = (int)auVar15._4_4_;
        auVar24._8_4_ = (int)auVar15._8_4_;
        auVar24._12_4_ = (int)auVar15._12_4_;
        auVar15 = vcvtdq2ps_avx(auVar24);
        local_78 = local_78 - auVar15._0_4_;
        iVar9 = -0xc;
        while (iVar9 != -3) {
          auVar25._0_4_ = (float)(iVar11 + iVar9);
          auVar25._4_12_ = in_register_00001384;
          auVar15 = vfmadd132ss_fma(auVar25,ZEXT416((uint)(float)auVar20._0_8_),
                                    ZEXT416((uint)fVar19));
          auVar36._8_4_ = 0x3effffff;
          auVar36._0_8_ = 0x3effffff3effffff;
          auVar36._12_4_ = 0x3effffff;
          auVar4._8_4_ = 0x80000000;
          auVar4._0_8_ = 0x8000000080000000;
          auVar4._12_4_ = 0x80000000;
          auVar16 = vpternlogd_avx512vl(auVar36,auVar15,auVar4,0xf8);
          local_68 = auVar13._0_4_;
          auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
          auVar15 = vroundss_avx(auVar15,auVar15,0xb);
          col = (int)auVar15._0_4_;
          auVar26._0_4_ = (int)auVar15._0_4_;
          auVar26._4_4_ = (int)auVar15._4_4_;
          auVar26._8_4_ = (int)auVar15._8_4_;
          auVar26._12_4_ = (int)auVar15._12_4_;
          auVar15 = vcvtdq2ps_avx(auVar26);
          local_68 = local_68 - auVar15._0_4_;
          fVar17 = expf((local_68 * local_68 + local_78 * local_78) * (-0.08 / (fVar19 * fVar19)));
          fVar18 = haarX_improved(iimage,row,col,s);
          auVar30._0_4_ = haarY_improved(iimage,row,col,s);
          auVar30._4_60_ = extraout_var;
          auVar15 = vinsertps_avx(auVar30._0_16_,ZEXT416((uint)fVar18),0x10);
          iVar9 = iVar9 + 1;
          auVar27._0_4_ = fVar17 * auVar15._0_4_;
          auVar27._4_4_ = fVar17 * auVar15._4_4_;
          auVar27._8_4_ = fVar17 * auVar15._8_4_;
          auVar27._12_4_ = fVar17 * auVar15._12_4_;
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar15 = vandps_avx512vl(auVar27,auVar5);
          auVar15 = vmovlhps_avx(auVar27,auVar15);
          local_98._4_4_ = (float)local_98._4_4_ + auVar15._4_4_;
          local_98._0_4_ = (float)local_98._0_4_ + auVar15._0_4_;
          fStack_90 = fStack_90 + auVar15._8_4_;
          fStack_8c = fStack_8c + auVar15._12_4_;
        }
      }
      iVar10 = iVar10 + 5;
      fVar17 = expf((local_e8 * local_e8 + fVar31 * fVar31) * -0.22222222);
      auVar28._0_4_ = fVar17 * (float)local_98._0_4_;
      auVar28._4_4_ = fVar17 * (float)local_98._4_4_;
      auVar28._8_4_ = fVar17 * fStack_90;
      auVar28._12_4_ = fVar17 * fStack_8c;
      local_e0 = local_e0 + 5;
      auVar37._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar37._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar37._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar37._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar15 = vshufpd_avx(auVar28,auVar28,1);
      *(undefined1 (*) [16])(ipoint->descriptor + local_d8) = auVar28;
      local_d8 = local_d8 + 4;
      auVar14 = vmovshdup_avx(auVar37);
      auVar14 = vfmadd231ss_fma(auVar14,auVar28,auVar28);
      auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar14);
      auVar14 = vshufps_avx(auVar28,auVar28,0xff);
      auVar14 = vfmadd213ss_fma(auVar14,auVar14,auVar15);
      auVar29 = ZEXT464((uint)(auVar29._0_4_ + auVar14._0_4_));
    }
    iVar11 = iVar11 + 5;
  }
  if (auVar29._0_4_ < 0.0) {
    fVar19 = sqrtf(auVar29._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar29._0_16_,auVar29._0_16_);
    fVar19 = auVar12._0_4_;
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
    ipoint->descriptor[lVar8] = (1.0 / fVar19) * ipoint->descriptor[lVar8];
  }
  return;
}

Assistant:

void get_msurf_descriptor_inlined(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_improved_flip
        - inlined gaussian function and removed its noralization constatnt (as we normalize in the end)

    ideas:
        - keep xs_sub_sample_x and xs_sub_sample_x_squared as int and cast in expf (same for y)
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}